

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktOpaqueTypeIndexingTests.cpp
# Opt level: O0

DataType vkt::shaderexecutor::anon_unknown_0::getSamplerOutputType(DataType samplerType)

{
  InternalError *this;
  allocator<char> local_31;
  string local_30;
  DataType local_10;
  DataType local_c;
  DataType samplerType_local;
  
  switch(samplerType) {
  case TYPE_SAMPLER_1D:
  case TYPE_SAMPLER_2D:
  case TYPE_SAMPLER_CUBE:
  case TYPE_SAMPLER_2D_ARRAY:
  case TYPE_SAMPLER_3D:
    local_c = TYPE_FLOAT_VEC4;
    break;
  default:
    local_10 = samplerType;
    this = (InternalError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Invalid sampler type",&local_31);
    tcu::InternalError::InternalError(this,&local_30);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  case TYPE_SAMPLER_1D_SHADOW:
  case TYPE_SAMPLER_2D_SHADOW:
  case TYPE_SAMPLER_CUBE_SHADOW:
  case TYPE_SAMPLER_2D_ARRAY_SHADOW:
    local_c = TYPE_FLOAT;
    break;
  case TYPE_INT_SAMPLER_1D:
  case TYPE_INT_SAMPLER_2D:
  case TYPE_INT_SAMPLER_CUBE:
  case TYPE_INT_SAMPLER_2D_ARRAY:
  case TYPE_INT_SAMPLER_3D:
    local_c = TYPE_INT_VEC4;
    break;
  case TYPE_UINT_SAMPLER_1D:
  case TYPE_UINT_SAMPLER_2D:
  case TYPE_UINT_SAMPLER_CUBE:
  case TYPE_UINT_SAMPLER_2D_ARRAY:
  case TYPE_UINT_SAMPLER_3D:
    local_c = TYPE_UINT_VEC4;
  }
  return local_c;
}

Assistant:

static glu::DataType getSamplerOutputType (glu::DataType samplerType)
{
	switch (samplerType)
	{
		case glu::TYPE_SAMPLER_1D:
		case glu::TYPE_SAMPLER_2D:
		case glu::TYPE_SAMPLER_CUBE:
		case glu::TYPE_SAMPLER_2D_ARRAY:
		case glu::TYPE_SAMPLER_3D:
			return glu::TYPE_FLOAT_VEC4;

		case glu::TYPE_SAMPLER_1D_SHADOW:
		case glu::TYPE_SAMPLER_2D_SHADOW:
		case glu::TYPE_SAMPLER_CUBE_SHADOW:
		case glu::TYPE_SAMPLER_2D_ARRAY_SHADOW:
			return glu::TYPE_FLOAT;

		case glu::TYPE_INT_SAMPLER_1D:
		case glu::TYPE_INT_SAMPLER_2D:
		case glu::TYPE_INT_SAMPLER_CUBE:
		case glu::TYPE_INT_SAMPLER_2D_ARRAY:
		case glu::TYPE_INT_SAMPLER_3D:
			return glu::TYPE_INT_VEC4;

		case glu::TYPE_UINT_SAMPLER_1D:
		case glu::TYPE_UINT_SAMPLER_2D:
		case glu::TYPE_UINT_SAMPLER_CUBE:
		case glu::TYPE_UINT_SAMPLER_2D_ARRAY:
		case glu::TYPE_UINT_SAMPLER_3D:
			return glu::TYPE_UINT_VEC4;

		default:
			throw tcu::InternalError("Invalid sampler type");
	}
}